

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecmult_gen_blind(void)

{
  int iVar1;
  secp256k1_ge pge;
  secp256k1_ge p;
  secp256k1_gej pgej2;
  secp256k1_gej pgej;
  uchar seed32 [32];
  secp256k1_scalar b;
  secp256k1_scalar key;
  secp256k1_scalar *in_stack_fffffffffffffde8;
  secp256k1_scalar *in_stack_fffffffffffffdf0;
  secp256k1_ge *in_stack_fffffffffffffe10;
  secp256k1_ge *in_stack_fffffffffffffe18;
  secp256k1_gej *in_stack_fffffffffffffe38;
  secp256k1_ge *in_stack_fffffffffffffe40;
  secp256k1_ge *in_stack_fffffffffffffe68;
  secp256k1_gej *in_stack_fffffffffffffe70;
  secp256k1_gej *in_stack_fffffffffffffee8;
  secp256k1_gej *in_stack_fffffffffffffef0;
  secp256k1_scalar *in_stack_ffffffffffffff20;
  secp256k1_gej *in_stack_ffffffffffffff28;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffff30;
  uchar *in_stack_ffffffffffffff78;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffff80;
  
  testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_fffffffffffffe10);
  secp256k1_ecmult_gen
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  testrand256((uchar *)in_stack_fffffffffffffdf0);
  memcpy(&stack0xfffffffffffffe40,&(CTX->ecmult_gen_ctx).ge_offset,0x58);
  secp256k1_ecmult_gen_blind(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  iVar1 = secp256k1_scalar_eq(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x15be,
            "test condition failed: !secp256k1_scalar_eq(&b, &CTX->ecmult_gen_ctx.scalar_offset)");
    abort();
  }
  secp256k1_ecmult_gen
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  iVar1 = gej_xyz_equals_gej(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x15c0,"test condition failed: !gej_xyz_equals_gej(&pgej, &pgej2)");
    abort();
  }
  iVar1 = secp256k1_ge_eq_var(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x15c1,
            "test condition failed: !secp256k1_ge_eq_var(&p, &CTX->ecmult_gen_ctx.ge_offset)");
    abort();
  }
  secp256k1_ge_set_gej(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x15c3,"test condition failed: secp256k1_gej_eq_ge_var(&pgej2, &pge)");
    abort();
  }
  return;
}

Assistant:

static void test_ecmult_gen_blind(void) {
    /* Test ecmult_gen() blinding and confirm that the blinding changes, the affine points match, and the z's don't match. */
    secp256k1_scalar key;
    secp256k1_scalar b;
    unsigned char seed32[32];
    secp256k1_gej pgej;
    secp256k1_gej pgej2;
    secp256k1_ge p;
    secp256k1_ge pge;
    testutil_random_scalar_order_test(&key);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &pgej, &key);
    testrand256(seed32);
    b = CTX->ecmult_gen_ctx.scalar_offset;
    p = CTX->ecmult_gen_ctx.ge_offset;
    secp256k1_ecmult_gen_blind(&CTX->ecmult_gen_ctx, seed32);
    CHECK(!secp256k1_scalar_eq(&b, &CTX->ecmult_gen_ctx.scalar_offset));
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &pgej2, &key);
    CHECK(!gej_xyz_equals_gej(&pgej, &pgej2));
    CHECK(!secp256k1_ge_eq_var(&p, &CTX->ecmult_gen_ctx.ge_offset));
    secp256k1_ge_set_gej(&pge, &pgej);
    CHECK(secp256k1_gej_eq_ge_var(&pgej2, &pge));
}